

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

int __thiscall
c4::basic_substring<const_char>::compare(basic_substring<const_char> *this,char *that,size_t sz)

{
  char *pcVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  error_flags eVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  
  if (sz != 0 && that == (char *)0x0) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      iVar6 = (*pcVar3)();
      return iVar6;
    }
    handle_error(0x1f7f77,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14de,"that || sz == 0");
  }
  pcVar1 = this->str;
  if ((pcVar1 == (char *)0x0) && (this->len != 0)) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar3 = (code *)swi(3);
      iVar6 = (*pcVar3)();
      return iVar6;
    }
    handle_error(0x1f7f77,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14df,"str || len == 0");
  }
  uVar2 = this->len;
  if ((that == (char *)0x0) || (pcVar1 == (char *)0x0)) {
    uVar8 = 0;
    if (uVar2 == sz) {
      if (sz != 0) {
        eVar5 = get_error_flags();
        if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          iVar6 = (*pcVar3)();
          return iVar6;
        }
        handle_error(0x1f7f77,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14f1,"len == 0 && sz == 0");
      }
    }
    else {
      uVar8 = -(uint)(uVar2 < sz) | 1;
    }
  }
  else {
    sVar7 = sz;
    if (uVar2 < sz) {
      sVar7 = uVar2;
    }
    if (sVar7 != 0) {
      uVar9 = 0;
      do {
        if (pcVar1[uVar9] != that[uVar9]) {
          return (uint)(that[uVar9] <= pcVar1[uVar9]) * 2 + -1;
        }
        uVar9 = uVar9 + 1;
      } while (sVar7 != uVar9);
    }
    uVar8 = 0xffffffff;
    if (sz <= uVar2) {
      uVar8 = (uint)(uVar2 != sz);
    }
  }
  return uVar8;
}

Assistant:

C4_PURE int compare(const char *C4_RESTRICT that, size_t sz) const noexcept
    {
        C4_XASSERT(that || sz  == 0);
        C4_XASSERT(str  || len == 0);
        if(C4_LIKELY(str && that))
        {
            {
                const size_t min = len < sz ? len : sz;
                for(size_t i = 0; i < min; ++i)
                    if(str[i] != that[i])
                        return str[i] < that[i] ? -1 : 1;
            }
            if(len < sz)
                return -1;
            else if(len == sz)
                return 0;
            else
                return 1;
        }
        else if(len == sz)
        {
            C4_XASSERT(len == 0 && sz == 0);
            return 0;
        }
        return len < sz ? -1 : 1;
    }